

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O0

Elf32_Sym * elf32_symtab(LinkFile *lf,Elf32_Ehdr *ehdr,int idx)

{
  uint32_t uVar1;
  Elf32_Sym *pEVar2;
  void *in_RSI;
  char *in_RDI;
  uint32_t shtype;
  Elf32_Sym *symtab;
  Elf32_Shdr *shdr;
  bool be;
  void *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  bool be_00;
  LinkFile *lf_00;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  LinkFile *in_stack_ffffffffffffffd8;
  
  be_00 = (bool)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  elf32_shdr(in_stack_ffffffffffffffd8,
             (Elf32_Ehdr *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (uint16_t)((ulong)in_stack_ffffffffffffffc8 >> 0x30));
  uVar1 = read32(be_00,in_stack_ffffffffffffffa8);
  if ((uVar1 != 2) && (uVar1 != 0xb)) {
    error(0x32,*(undefined8 *)(in_RDI + 0x10),elf32_symtab::tabname,*(undefined8 *)(in_RDI + 0x20));
  }
  uVar1 = read32((bool)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffa8);
  pEVar2 = (Elf32_Sym *)((long)in_RSI + (ulong)uVar1);
  lf_00 = (LinkFile *)elf32_symtab::tabname;
  read32((bool)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffa8);
  elf_check_offset(lf_00,in_RDI,in_RSI,(lword)in_stack_ffffffffffffffa8);
  return pEVar2;
}

Assistant:

static struct Elf32_Sym *elf32_symtab(struct LinkFile *lf,
                                      struct Elf32_Ehdr *ehdr,int idx)
/* returns a pointer to the symbol table */
{
  static char *tabname = "symbol";
  bool be = (ehdr->e_ident[EI_DATA] == ELFDATA2MSB);
  struct Elf32_Shdr *shdr;
  struct Elf32_Sym *symtab;
  uint32_t shtype;

  shdr = elf32_shdr(lf,ehdr,idx);
  shtype = read32(be,shdr->sh_type);
  if (shtype!=SHT_SYMTAB && shtype!=SHT_DYNSYM)
     error(50,lf->pathname,tabname,lf->objname);  /* illegal type */
  symtab = (struct Elf32_Sym *)((uint8_t *)ehdr + read32(be,shdr->sh_offset));
  elf_check_offset(lf,tabname,symtab,read32(be,shdr->sh_size));
  return symtab;
}